

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

BYTE * __thiscall
Js::SharedArrayBuffer::AllocBuffer(SharedArrayBuffer *this,uint32 length,uint32 maxLength)

{
  Memory *this_00;
  uchar *puVar1;
  TrackAllocData local_40;
  uint32 local_18;
  uint32 local_14;
  uint32 maxLength_local;
  uint32 length_local;
  SharedArrayBuffer *this_local;
  
  local_18 = maxLength;
  local_14 = length;
  _maxLength_local = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&unsigned_char::typeinfo,0,(ulong)length,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
             ,0xf0);
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
  puVar1 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                     (this_00,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,(ulong)local_14
                     );
  return puVar1;
}

Assistant:

BYTE* SharedArrayBuffer::AllocBuffer(uint32 length, uint32 maxLength)
    {
        Unused(maxLength); // WebAssembly only
#if ENABLE_FAST_ARRAYBUFFER
        if (this->IsValidVirtualBufferLength(length))
        {
            return (BYTE*)AsmJsVirtualAllocator(length);
        }
        else
#endif
        {
            return HeapNewNoThrowArray(BYTE, length);
        }
    }